

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O2

string * __thiscall Edge::GetBinding(string *__return_storage_ptr__,Edge *this,string *key)

{
  EdgeEnv env;
  EdgeEnv local_38;
  
  local_38.super_Env._vptr_Env = (_func_int **)&PTR__EdgeEnv_0013bac0;
  local_38.lookups_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.lookups_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.lookups_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.escape_in_out_ = kShellEscape;
  local_38.recursive_ = false;
  local_38.edge_ = this;
  EdgeEnv::LookupVariable(__return_storage_ptr__,&local_38,key);
  EdgeEnv::~EdgeEnv(&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string Edge::GetBinding(const std::string& key) const {
  EdgeEnv env(this, EdgeEnv::kShellEscape);
  return env.LookupVariable(key);
}